

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd_io.c
# Opt level: O0

int gdGetWordLSB(short *result,gdIOCtx *ctx)

{
  int iVar1;
  int iVar2;
  int low;
  int high;
  gdIOCtx *ctx_local;
  short *result_local;
  
  iVar1 = (*ctx->getC)(ctx);
  if (iVar1 == -1) {
    result_local._4_4_ = 0;
  }
  else {
    iVar2 = (*ctx->getC)(ctx);
    if (iVar2 == -1) {
      result_local._4_4_ = 0;
    }
    else {
      if (result != (short *)0x0) {
        *result = (ushort)(iVar2 << 8) | (ushort)iVar1;
      }
      result_local._4_4_ = 1;
    }
  }
  return result_local._4_4_;
}

Assistant:

int gdGetWordLSB(signed short int *result, gdIOCtx *ctx)
{
	int high = 0, low = 0;
	low = (ctx->getC) (ctx);
	if (low == EOF) {
		return 0;
	}

	high = (ctx->getC) (ctx);
	if (high == EOF) {
		return 0;
	}

	if (result) {
		*result = (high << 8) | low;
	}

	return 1;
}